

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.h
# Opt level: O3

crc32c_t __thiscall absl::lts_20250127::crc_internal::CrcCordState::Checksum(CrcCordState *this)

{
  RefcountedRep *pRVar1;
  size_t sVar2;
  PrefixCrc *pPVar3;
  _Elt_pointer pPVar4;
  crc32c_t cVar5;
  _Elt_pointer pPVar6;
  
  pRVar1 = this->refcounted_rep_;
  pPVar6 = (pRVar1->rep).prefix_crc.
           super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pPVar6 == (pRVar1->rep).prefix_crc.
                super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    return (crc32c_t)0;
  }
  sVar2 = (pRVar1->rep).removed_prefix.length;
  if (sVar2 != 0) {
    if (pPVar6 == (pRVar1->rep).prefix_crc.
                  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pPVar3 = (pRVar1->rep).prefix_crc.
               super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      pPVar4 = pPVar3 + 0x1f;
      pPVar6 = pPVar3 + 0x20;
    }
    else {
      pPVar4 = pPVar6 + -1;
    }
    cVar5 = RemoveCrc32cPrefix((pRVar1->rep).removed_prefix.crc.crc_,(pPVar4->crc).crc_,
                               pPVar6[-1].length - sVar2);
    return (crc32c_t)cVar5.crc_;
  }
  if (pPVar6 == (pRVar1->rep).prefix_crc.
                super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pPVar6 = (pRVar1->rep).prefix_crc.
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  return (crc32c_t)pPVar6[-1].crc.crc_;
}

Assistant:

const Rep& rep() const { return refcounted_rep_->rep; }